

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

void __thiscall mat_lib::matrix<double>::copy_elements__(matrix<double> *this,matrix<double> *m)

{
  element_t eVar1;
  element_t *peVar2;
  size_t sVar3;
  ulong local_28;
  size_t j;
  size_t i;
  matrix<double> *m_local;
  matrix<double> *this_local;
  
  this->rows__ = m->rows__;
  this->columns__ = m->columns__;
  for (j = 0; j < this->rows__; j = j + 1) {
    for (local_28 = 0; local_28 < this->columns__; local_28 = local_28 + 1) {
      peVar2 = m->elements__;
      sVar3 = offset__(this,j,(int)local_28);
      eVar1 = peVar2[sVar3];
      peVar2 = this->elements__;
      sVar3 = offset__(this,j,(int)local_28);
      peVar2[sVar3] = eVar1;
    }
  }
  return;
}

Assistant:

void copy_elements__(const matrix& m)
      { 
        rows__=m.rows__; columns__=m.columns__;
        for(size_t i=0; i<rows__; i++) 
          for(size_t j=0; j<columns__; j++) elements__[offset__(i,j)]=m.elements__[offset__(i,j)]; 
      }